

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3HashInsert(Hash *pH,char *pKey,void *data)

{
  long lVar1;
  int iVar2;
  HashElem *pHVar3;
  void *in_RDX;
  char *in_RSI;
  Hash *in_RDI;
  long in_FS_OFFSET;
  void *old_data;
  HashElem *new_elem;
  HashElem *elem;
  uint h;
  u64 in_stack_ffffffffffffffa0;
  HashElem *in_stack_ffffffffffffffa8;
  _ht *pEntry;
  Hash *in_stack_ffffffffffffffb0;
  Hash *in_stack_ffffffffffffffb8;
  void *local_18;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  pHVar3 = findElementWithHash(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                               (uint *)in_stack_ffffffffffffffa8);
  if (pHVar3->data == (void *)0x0) {
    if (in_RDX == (void *)0x0) {
      local_18 = (void *)0x0;
    }
    else {
      pHVar3 = (HashElem *)sqlite3Malloc(in_stack_ffffffffffffffa0);
      local_18 = in_RDX;
      if (pHVar3 != (HashElem *)0x0) {
        pHVar3->pKey = in_RSI;
        pHVar3->data = in_RDX;
        in_RDI->count = in_RDI->count + 1;
        if (((9 < in_RDI->count) && (in_RDI->htsize * 2 < in_RDI->count)) &&
           (iVar2 = rehash(in_stack_ffffffffffffffb8,
                           (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20)), iVar2 != 0)) {
          local_c = strHash(in_RSI);
          local_c = local_c % in_RDI->htsize;
        }
        if (in_RDI->ht == (_ht *)0x0) {
          pEntry = (_ht *)0x0;
        }
        else {
          pEntry = in_RDI->ht + local_c;
        }
        insertElement(in_RDI,pEntry,pHVar3);
        local_18 = (void *)0x0;
      }
    }
  }
  else {
    local_18 = pHVar3->data;
    if (in_RDX == (void *)0x0) {
      removeElementGivenHash
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (uint)(in_stack_ffffffffffffffa0 >> 0x20));
    }
    else {
      pHVar3->data = in_RDX;
      pHVar3->pKey = in_RSI;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HashInsert(Hash *pH, const char *pKey, void *data){
  unsigned int h;       /* the hash of the key modulo hash table size */
  HashElem *elem;       /* Used to loop thru the element list */
  HashElem *new_elem;   /* New element added to the pH */

  assert( pH!=0 );
  assert( pKey!=0 );
  elem = findElementWithHash(pH,pKey,&h);
  if( elem->data ){
    void *old_data = elem->data;
    if( data==0 ){
      removeElementGivenHash(pH,elem,h);
    }else{
      elem->data = data;
      elem->pKey = pKey;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  new_elem = (HashElem*)sqlite3Malloc( sizeof(HashElem) );
  if( new_elem==0 ) return data;
  new_elem->pKey = pKey;
  new_elem->data = data;
  pH->count++;
  if( pH->count>=10 && pH->count > 2*pH->htsize ){
    if( rehash(pH, pH->count*2) ){
      assert( pH->htsize>0 );
      h = strHash(pKey) % pH->htsize;
    }
  }
  insertElement(pH, pH->ht ? &pH->ht[h] : 0, new_elem);
  return 0;
}